

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

bool QFontDatabase::removeApplicationEmojiFontFamily(QString *familyName)

{
  long lVar1;
  byte bVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QFontDatabasePrivate *db;
  QMutexLocker<QRecursiveMutex> locker;
  ExtendedScript in_stack_0000003c;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
  *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  AtomicType this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this._M_b._M_p = (__base_type)&DAT_aaaaaaaaaaaaaaaa;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::operator()
            (in_stack_ffffffffffffffc8);
  QMutexLocker<QRecursiveMutex>::QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)
             CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
             (QRecursiveMutex *)&stack0xffffffffffffffe8);
  QFontDatabasePrivate::instance();
  bVar2 = QFontDatabasePrivate::removeApplicationFallbackFontFamily
                    ((QFontDatabasePrivate *)this._M_b._M_p,in_stack_0000003c,in_RDI);
  QMutexLocker<QRecursiveMutex>::~QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)CONCAT17(bVar2,in_stack_ffffffffffffffd0));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QFontDatabase::removeApplicationEmojiFontFamily(const QString &familyName)
{
    QMutexLocker locker(fontDatabaseMutex());
    auto *db = QFontDatabasePrivate::instance();
    return db->removeApplicationFallbackFontFamily(QFontDatabasePrivate::Script_Emoji,
                                                   familyName);
}